

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxSoftBody::Read(PmxSoftBody *this,istream *param_1,PmxSetting *param_2)

{
  ostream *this_00;
  DeadlyImportError *this_01;
  allocator<char> local_41;
  string local_40;
  PmxSetting *local_20;
  PmxSetting *param_2_local;
  istream *param_1_local;
  PmxSoftBody *this_local;
  
  local_20 = param_2;
  param_2_local = (PmxSetting *)param_1;
  param_1_local = (istream *)this;
  this_00 = std::operator<<((ostream *)&std::cerr,"Not Implemented Exception");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"MMD: Not Implemented Exception",&local_41);
  DeadlyImportError::DeadlyImportError(this_01,&local_40);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void PmxSoftBody::Read(std::istream * /*stream*/, PmxSetting * /*setting*/)
	{
		std::cerr << "Not Implemented Exception" << std::endl;
        throw DeadlyImportError("MMD: Not Implemented Exception");
    }